

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_midiout.cpp
# Opt level: O1

void __thiscall MUSSong2::MUSSong2(MUSSong2 *this,FileReader *reader,EMidiDevice type,char *args)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  MUSHeader *pMVar4;
  undefined4 extraout_var_00;
  uint uVar5;
  int i;
  ulong uVar6;
  BYTE front [32];
  char local_58 [40];
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MUSSong2_006f43e8;
  this->MusHeader = (MUSHeader *)0x0;
  this->MusBuffer = (BYTE *)0x0;
  iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,local_58,0x20);
  if (CONCAT44(extraout_var,iVar2) == 0x20) {
    uVar6 = 0;
    do {
      if ((((local_58[uVar6] == 'M') && (local_58[uVar6 + 1] == 'U')) &&
          (local_58[uVar6 + 2] == 'S')) && (local_58[uVar6 + 3] == '\x1a')) goto LAB_00337b34;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x1d);
    uVar6 = 0xffffffff;
LAB_00337b34:
    if (-1 < (int)uVar6) {
      iVar2 = (int)reader->Length;
      uVar5 = iVar2 - (int)uVar6;
      if (7 < (int)uVar5) {
        pMVar4 = (MUSHeader *)operator_new__((ulong)uVar5);
        uVar6 = uVar6 & 0xffffffff;
        this->MusHeader = pMVar4;
        memcpy(pMVar4,local_58 + uVar6,0x20 - uVar6);
        iVar3 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (reader,(long)pMVar4 + (0x20 - uVar6),(ulong)uVar5 - (0x20 - uVar6));
        if ((CONCAT44(extraout_var_00,iVar3) == (long)(iVar2 + -0x20)) &&
           (pMVar4 = this->MusHeader, pMVar4->NumChans < 0x10)) {
          uVar1 = pMVar4->SongStart;
          this->MusBuffer = (BYTE *)((long)&pMVar4->Magic + (ulong)uVar1);
          uVar5 = uVar5 - uVar1;
          if ((int)(uint)pMVar4->SongLen < (int)uVar5) {
            uVar5 = (uint)pMVar4->SongLen;
          }
          this->MaxMusP = (long)(int)uVar5;
          (this->super_MIDIStreamer).Division = 0x8c;
          (this->super_MIDIStreamer).InitialTempo = 1000000;
        }
      }
    }
  }
  return;
}

Assistant:

MUSSong2::MUSSong2 (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), MusBuffer(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif

	BYTE front[32];
	int start;

	if (reader.Read(front, sizeof(front)) != sizeof(front))
	{
		return;
	}

	// To tolerate sloppy wads (diescum.wad, I'm looking at you), we search
	// the first 32 bytes of the file for a signature. My guess is that DMX
	// does no validation whatsoever and just assumes it was passed a valid
	// MUS file, since where the header is offset affects how it plays.
	start = MUSHeaderSearch(front, sizeof(front));
	if (start < 0)
	{
		return;
	}

	// Read the remainder of the song.
	int len = int(reader.GetLength() - start);
	if (len < (int)sizeof(MusHeader))
	{ // It's too short.
		return;
	}
	MusHeader = (MUSHeader *)new BYTE[len];
    memcpy(MusHeader, front + start, sizeof(front) - start);
    if (reader.Read((BYTE *)MusHeader + sizeof(front) - start, len - (sizeof(front) - start)) != (len - (32 - start)))
    {
        return;
    }

	// Do some validation of the MUS file.
	if (LittleShort(MusHeader->NumChans) > 15)
	{
		return;
	}

	MusBuffer = (BYTE *)MusHeader + LittleShort(MusHeader->SongStart);
	MaxMusP = MIN<int>(LittleShort(MusHeader->SongLen), len - LittleShort(MusHeader->SongStart));
	Division = 140;
	InitialTempo = 1000000;
}